

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QCalendarPopup::setCalendarWidget(QCalendarPopup *this,QCalendarWidget *cw)

{
  Data *pDVar1;
  QObject *pQVar2;
  QLayout *pQVar3;
  long in_FS_OFFSET;
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  Data *local_48;
  QObject *pQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QWidget::layout(&this->super_QWidget);
  pQVar3 = (QLayout *)QtPrivate::qobject_cast_helper<QVBoxLayout*,QObject>(&pQVar3->super_QObject);
  if (pQVar3 == (QLayout *)0x0) {
    pQVar3 = (QLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)pQVar3,&this->super_QWidget);
    local_48 = (Data *)0x0;
    pQStack_40 = (QObject *)0x0;
    QLayout::setContentsMargins(pQVar3,(QMargins *)&local_48);
    (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,0);
  }
  pDVar1 = (this->calendar).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (pQVar2 = (this->calendar).wp.value, pQVar2 != (QObject *)0x0)) {
    (**(code **)(*(long *)pQVar2 + 0x20))();
  }
  QPointer<QCalendarWidget>::QPointer<void>((QPointer<QCalendarWidget> *)&local_48,cw);
  QWeakPointer<QObject>::operator=(&(this->calendar).wp,(QWeakPointer<QObject> *)&local_48);
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_48);
  QBoxLayout::addWidget((QBoxLayout *)pQVar3,&cw->super_QWidget,0,(Alignment)0x0);
  QObject::connect(local_50,(char *)cw,(QObject *)"2activated(QDate)",(char *)this,0x659cd7);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QObject::connect(local_58,(char *)cw,(QObject *)"2clicked(QDate)",(char *)this,0x659cd7);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QObject::connect(local_60,(char *)cw,(QObject *)"2selectionChanged()",(char *)this,0x659d00);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QWidget::setFocus(&cw->super_QWidget);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarPopup::setCalendarWidget(QCalendarWidget *cw)
{
    Q_ASSERT(cw);
    QVBoxLayout *widgetLayout = qobject_cast<QVBoxLayout*>(layout());
    if (!widgetLayout) {
        widgetLayout = new QVBoxLayout(this);
        widgetLayout->setContentsMargins(QMargins());
        widgetLayout->setSpacing(0);
    }
    delete calendar.data();
    calendar = QPointer<QCalendarWidget>(cw);
    widgetLayout->addWidget(cw);

    connect(cw, SIGNAL(activated(QDate)), this, SLOT(dateSelected(QDate)));
    connect(cw, SIGNAL(clicked(QDate)), this, SLOT(dateSelected(QDate)));
    connect(cw, SIGNAL(selectionChanged()), this, SLOT(dateSelectionChanged()));

    cw->setFocus();
}